

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clEnqueueSVMMigrateMem
                 (cl_command_queue command_queue,cl_uint num_svm_pointers,void **svm_pointers,
                 size_t *sizes,cl_mem_migration_flags flags,cl_uint num_events_in_wait_list,
                 cl_event *event_wait_list,cl_event *event)

{
  char *enqueueCounter_00;
  CLIntercept *this;
  cl_mem_migration_flags cVar1;
  cl_uint cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  bool bVar5;
  undefined1 uVar6;
  cl_icd_dispatch *pcVar7;
  SConfig *pSVar8;
  SConfig *pSVar9;
  size_t *in_RCX;
  void **in_RDX;
  cl_uint in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  cl_mem_migration_flags in_R8;
  cl_uint in_R9D;
  cl_event *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  CLIntercept *in_stack_00000098;
  time_point toolEnd_1;
  time_point toolStart_1;
  cl_int e;
  time_point toolEnd;
  time_point toolStart;
  time_point cpuEnd;
  time_point cpuStart;
  bool isLocalEvent;
  cl_event local_event;
  time_point queuedTime;
  string eventWaitListString;
  uint64_t enqueueCounter;
  cl_int retVal;
  CLIntercept *pIntercept;
  undefined8 in_stack_fffffffffffffb08;
  undefined4 uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  _cl_event *in_stack_fffffffffffffb20;
  CObjectTracker *in_stack_fffffffffffffb28;
  uint64_t in_stack_fffffffffffffb30;
  CLIntercept *in_stack_fffffffffffffb38;
  allocator *paVar11;
  CLIntercept *in_stack_fffffffffffffb40;
  cl_mem_migration_flags in_stack_fffffffffffffb70;
  CLIntercept *in_stack_fffffffffffffb78;
  cl_event *in_stack_fffffffffffffb80;
  cl_event *in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  cl_uint numEvents;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar12;
  char *in_stack_fffffffffffffb98;
  CLIntercept *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  SConfig *in_stack_fffffffffffffbb0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffbb8;
  CLIntercept *in_stack_fffffffffffffbc0;
  time_point in_stack_fffffffffffffbc8;
  time_point in_stack_fffffffffffffbd0;
  time_point in_stack_fffffffffffffbd8;
  time_point in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffc10;
  allocator *in_stack_fffffffffffffc18;
  undefined6 in_stack_fffffffffffffc20;
  byte in_stack_fffffffffffffc26;
  undefined1 in_stack_fffffffffffffc27;
  allocator *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  SConfig *in_stack_fffffffffffffc38;
  undefined6 in_stack_fffffffffffffc40;
  undefined1 uVar13;
  CLIntercept *in_stack_fffffffffffffc48;
  time_point in_stack_fffffffffffffc50;
  cl_int in_stack_fffffffffffffd24;
  char *in_stack_fffffffffffffd28;
  cl_int errorCode;
  CLIntercept *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  CLIntercept *in_stack_fffffffffffffd40;
  allocator local_289;
  string local_288 [32];
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  allocator local_231;
  string local_230 [16];
  string local_1f8 [32];
  undefined8 local_1d8;
  cl_int local_1cc;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  size_t *local_1a8;
  undefined1 local_199 [40];
  allocator local_171;
  string local_170 [45];
  byte local_143;
  byte local_142;
  allocator local_141;
  string local_140 [40];
  size_t *local_118;
  allocator local_109;
  size_t *in_stack_fffffffffffffef8;
  cl_uint in_stack_ffffffffffffff04;
  cl_kernel in_stack_ffffffffffffff08;
  uint64_t in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  CLIntercept *in_stack_ffffffffffffff20;
  undefined8 local_d8;
  size_t *in_stack_ffffffffffffff30;
  cl_command_queue in_stack_ffffffffffffff38;
  undefined8 local_b8 [2];
  string local_a8 [48];
  string local_78 [32];
  char *local_58;
  cl_int local_4c;
  CLIntercept *local_48;
  cl_uint local_3c;
  cl_mem_migration_flags local_38;
  size_t *local_30;
  void **local_28;
  cl_uint local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  cl_int local_c;
  
  uVar6 = (undefined1)((ulong)in_stack_fffffffffffffba8 >> 0x38);
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  numEvents = (cl_uint)((ulong)in_stack_fffffffffffffb90 >> 0x20);
  local_3c = in_R9D;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_1c = in_ESI;
  local_18 = in_RDI;
  local_48 = GetIntercept();
  if ((local_48 == (CLIntercept *)0x0) ||
     (pcVar7 = CLIntercept::dispatch(local_48),
     pcVar7->clEnqueueSVMMigrateMem == (cl_api_clEnqueueSVMMigrateMem)0x0)) {
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,(int *)&stack0xfffffffffffffd24)
    ;
    local_c = -0x24;
  }
  else {
    local_4c = 0;
    local_58 = (char *)CLIntercept::incrementEnqueueCounter(in_stack_fffffffffffffb78);
    pSVar8 = CLIntercept::config(local_48);
    if ((((pSVar8->AubCapture & 1U) != 0) &&
        (bVar4 = CLIntercept::checkAubCaptureEnqueueLimits(local_48,(uint64_t)local_58), bVar4)) &&
       (pSVar8 = CLIntercept::config(local_48), (pSVar8->AubCaptureIndividualEnqueues & 1U) == 0)) {
      uVar10 = 0;
      in_stack_fffffffffffffb10 = local_18;
      CLIntercept::startAubCapture
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
    }
    pSVar8 = CLIntercept::config(local_48);
    if ((pSVar8->NullEnqueue & 1U) == 0) {
      getFormattedEventWaitList_abi_cxx11_
                (in_stack_fffffffffffffb38,(cl_uint)(in_stack_fffffffffffffb30 >> 0x20),
                 (cl_event *)in_stack_fffffffffffffb28);
      pSVar8 = CLIntercept::config(local_48);
      pbVar3 = local_18;
      cVar2 = local_1c;
      this = local_48;
      enqueueCounter_00 = local_58;
      if ((pSVar8->CallLogging & 1U) != 0) {
        CLIntercept::enumName(local_48);
        CEnumNameMap::name_mem_migration_flags_abi_cxx11_
                  ((CEnumNameMap *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
        in_stack_fffffffffffffb10 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::c_str();
        cVar1 = local_38;
        in_stack_fffffffffffffb20 = (_cl_event *)std::__cxx11::string::c_str();
        CLIntercept::callLoggingEnter
                  (this,"clEnqueueSVMMigrateMem",(uint64_t)enqueueCounter_00,(cl_kernel)0x0,
                   "queue = %p, num_svm_pointers = %u, flags = %s (%llX)%s",pbVar3,
                   CONCAT44(uVar10,cVar2),in_stack_fffffffffffffb10,cVar1);
        std::__cxx11::string::~string(local_a8);
      }
      pSVar8 = CLIntercept::config(local_48);
      if ((pSVar8->EventChecking & 1U) != 0) {
        CLIntercept::checkEventList
                  (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,numEvents,
                   in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      local_b8[0] = 0;
      bVar4 = false;
      pSVar8 = CLIntercept::config(local_48);
      if ((((pSVar8->DevicePerformanceTiming & 1U) != 0) ||
          (pSVar8 = CLIntercept::config(local_48), (pSVar8->ITTPerformanceTiming & 1U) != 0)) ||
         ((pSVar8 = CLIntercept::config(local_48), (pSVar8->ChromePerformanceTiming & 1U) != 0 ||
          (pSVar8 = CLIntercept::config(local_48),
          (pSVar8->DevicePerfCounterEventBasedSampling & 1U) != 0)))) {
        local_b8[1] = std::chrono::_V2::steady_clock::now();
        bVar4 = in_stack_00000010 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar4) {
          in_stack_00000010 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      pSVar8 = CLIntercept::config(local_48);
      if (((pSVar8->HostPerformanceTiming & 1U) != 0) ||
         (pSVar8 = CLIntercept::config(local_48), (pSVar8->ChromeCallLogging & 1U) != 0)) {
        in_stack_ffffffffffffff30 = (size_t *)std::chrono::_V2::steady_clock::now();
      }
      pcVar7 = CLIntercept::dispatch(local_48);
      in_stack_fffffffffffffb10 = in_stack_00000010;
      local_4c = (*pcVar7->clEnqueueSVMMigrateMem)
                           ((cl_command_queue)local_18,local_1c,local_28,local_30,local_38,local_3c,
                            in_stack_00000008,(cl_event *)in_stack_00000010);
      pSVar8 = CLIntercept::config(local_48);
      if (((pSVar8->HostPerformanceTiming & 1U) != 0) ||
         (pSVar8 = CLIntercept::config(local_48), (pSVar8->ChromeCallLogging & 1U) != 0)) {
        local_d8 = std::chrono::_V2::steady_clock::now();
        pSVar8 = CLIntercept::config(local_48);
        if (((pSVar8->HostPerformanceTiming & 1U) != 0) &&
           (bVar5 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_48,(uint64_t)local_58), bVar5)) {
          std::allocator<char>::allocator();
          local_118 = in_stack_ffffffffffffff30;
          std::__cxx11::string::string((string *)&stack0xfffffffffffffef8,"",&local_109);
          local_140._32_8_ = local_d8;
          in_stack_ffffffffffffff30 = local_118;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffbd0.__d.__r,
                     (char *)in_stack_fffffffffffffbc8.__d.__r,(string *)in_stack_fffffffffffffbc0,
                     in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
          std::allocator<char>::~allocator((allocator<char> *)&local_109);
        }
      }
      pSVar8 = CLIntercept::config(local_48);
      if ((((((pSVar8->DevicePerformanceTiming & 1U) != 0) ||
            (pSVar9 = CLIntercept::config(local_48), (pSVar9->ITTPerformanceTiming & 1U) != 0)) ||
           (in_stack_fffffffffffffc50.__d.__r = (duration)CLIntercept::config(local_48),
           (((SConfig *)in_stack_fffffffffffffc50.__d.__r)->ChromePerformanceTiming & 1U) != 0)) ||
          (in_stack_fffffffffffffc48 = (CLIntercept *)CLIntercept::config(local_48),
          ((ulong)(in_stack_fffffffffffffc48->m_Dispatch).clSetCommandQueueProperty & 1) != 0)) &&
         (in_stack_00000010 !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        local_142 = 0;
        local_143 = 0;
        uVar6 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits(local_48,(uint64_t)local_58);
        in_stack_fffffffffffffc26 = false;
        if ((bool)uVar6) {
          in_stack_fffffffffffffc38 = CLIntercept::config(local_48);
          in_stack_fffffffffffffc37 = true;
          in_stack_fffffffffffffc26 = true;
          if ((in_stack_fffffffffffffc38->DevicePerformanceTimingSkipUnmap & 1U) != 0) {
            in_stack_fffffffffffffc28 = &local_141;
            std::allocator<char>::allocator();
            local_142 = 1;
            std::__cxx11::string::string
                      (local_140,"clEnqueueSVMMigrateMem",in_stack_fffffffffffffc28);
            local_143 = 1;
            in_stack_fffffffffffffc27 =
                 std::operator!=(in_stack_fffffffffffffb10,(char *)in_stack_00000008);
            in_stack_fffffffffffffc37 = in_stack_fffffffffffffc27;
            in_stack_fffffffffffffc26 = in_stack_fffffffffffffc27;
          }
        }
        uVar13 = in_stack_fffffffffffffc26;
        if ((local_143 & 1) != 0) {
          std::__cxx11::string::~string(local_140);
        }
        if ((local_142 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_141);
        }
        if ((in_stack_fffffffffffffc26 & 1) != 0) {
          local_170._32_8_ = local_b8[1];
          in_stack_fffffffffffffc18 = &local_171;
          in_stack_fffffffffffffc10 = local_58;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_170,"",in_stack_fffffffffffffc18);
          CLIntercept::addTimingEvent
                    (in_stack_fffffffffffffc48,
                     (char *)CONCAT17(uVar6,CONCAT16(uVar13,in_stack_fffffffffffffc40)),
                     (uint64_t)in_stack_fffffffffffffc38,in_stack_fffffffffffffc50,
                     (string *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                     (cl_command_queue)in_stack_fffffffffffffc28,(cl_event)pSVar8);
          std::__cxx11::string::~string(local_170);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
        }
        if (bVar4) {
          pcVar7 = CLIntercept::dispatch(local_48);
          (*pcVar7->clReleaseEvent)((cl_event)*(duration *)in_stack_00000010);
          in_stack_00000010 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      pSVar8 = CLIntercept::config(local_48);
      if (((((pSVar8->ErrorLogging & 1U) != 0) ||
           (pSVar8 = CLIntercept::config(local_48), (pSVar8->ErrorAssert & 1U) != 0)) ||
          (pSVar8 = CLIntercept::config(local_48), (pSVar8->NoErrors & 1U) != 0)) && (local_4c != 0)
         ) {
        in_stack_fffffffffffffbe0.__d.__r = (duration)CLIntercept::config(local_48);
        if ((((SConfig *)in_stack_fffffffffffffbe0.__d.__r)->ErrorLogging & 1U) != 0) {
          CLIntercept::logError
                    (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd24);
        }
        in_stack_fffffffffffffbd8.__d.__r = (duration)CLIntercept::config(local_48);
        if ((((SConfig *)in_stack_fffffffffffffbd8.__d.__r)->ErrorAssert & 1U) != 0) {
          raise(5);
        }
        in_stack_fffffffffffffbd0.__d.__r = (duration)CLIntercept::config(local_48);
        if (((ulong)(((CLIntercept *)in_stack_fffffffffffffbd0.__d.__r)->m_Dispatch).
                    clCreateSubDevices & 0x100000000) != 0) {
          local_4c = 0;
        }
      }
      in_stack_fffffffffffffbc8.__d.__r = (duration)CLIntercept::config(local_48);
      if ((((SConfig *)in_stack_fffffffffffffbc8.__d.__r)->LeakChecking & 1U) != 0) {
        in_stack_fffffffffffffbc0 = (CLIntercept *)CLIntercept::objectTracker(local_48);
        if (in_stack_00000010 ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          in_stack_fffffffffffffbb8.__d.__r = (duration)0;
        }
        else {
          in_stack_fffffffffffffbb8.__d.__r = *(duration *)in_stack_00000010;
        }
        CObjectTracker::AddAllocation<_cl_event*>
                  (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
      }
      in_stack_fffffffffffffbb0 = CLIntercept::config(local_48);
      if ((in_stack_fffffffffffffbb0->CallLogging & 1U) != 0) {
        CLIntercept::callLoggingExit
                  (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,numEvents,
                   in_stack_fffffffffffffb88,(cl_sync_point_khr *)in_stack_fffffffffffffb80);
      }
      pSVar8 = CLIntercept::config(local_48);
      if ((pSVar8->ChromeCallLogging & 1U) != 0) {
        in_stack_fffffffffffffba0 = (CLIntercept *)local_199;
        std::allocator<char>::allocator();
        local_1a8 = in_stack_ffffffffffffff30;
        std::__cxx11::string::string
                  ((string *)(local_199 + 1),"",(allocator *)in_stack_fffffffffffffba0);
        local_1b0 = local_d8;
        CLIntercept::chromeCallLoggingExit
                  (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.__d.__r,
                   (string *)in_stack_fffffffffffffbb0,SUB81((ulong)pSVar8 >> 0x38,0),
                   (uint64_t)in_stack_fffffffffffffba0,in_stack_fffffffffffffbd0,
                   in_stack_fffffffffffffbc8);
        std::__cxx11::string::~string((string *)(local_199 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_199);
      }
      uVar6 = (undefined1)((ulong)pSVar8 >> 0x38);
      if (in_stack_00000010 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        tVar12.__d.__r = (duration)0;
      }
      else {
        tVar12.__d.__r = *(duration *)in_stack_00000010;
      }
      if ((tVar12.__d.__r != 0) &&
         ((pSVar8 = CLIntercept::config(local_48), (pSVar8->ChromeCallLogging & 1U) != 0 ||
          (pSVar8 = CLIntercept::config(local_48), (pSVar8->ChromePerformanceTiming & 1U) != 0)))) {
        CLIntercept::addEvent
                  (in_stack_fffffffffffffb40,(cl_event)in_stack_fffffffffffffb38,
                   in_stack_fffffffffffffb30);
      }
      std::__cxx11::string::~string(local_78);
    }
    errorCode = (cl_int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
    pSVar8 = CLIntercept::config(local_48);
    if ((pSVar8->FinishAfterEnqueue & 1U) == 0) {
      pSVar8 = CLIntercept::config(local_48);
      if ((pSVar8->FlushAfterEnqueue & 1U) != 0) {
        pcVar7 = CLIntercept::dispatch(local_48);
        (*pcVar7->clFlush)((cl_command_queue)local_18);
      }
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      pSVar8 = CLIntercept::config(local_48);
      if (((pSVar8->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar8 = CLIntercept::config(local_48), (pSVar8->HostPerformanceTiming & 1U) != 0 ||
          (pSVar8 = CLIntercept::config(local_48), (pSVar8->ChromeCallLogging & 1U) != 0)))) {
        local_1c8 = std::chrono::_V2::steady_clock::now();
        local_1b8 = local_1c8;
      }
      CLIntercept::logFlushOrFinishAfterEnqueueStart
                ((CLIntercept *)
                 CONCAT17(in_stack_fffffffffffffc27,
                          CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)),
                 (char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      pcVar7 = CLIntercept::dispatch(local_48);
      local_1cc = (*pcVar7->clFinish)((cl_command_queue)local_18);
      CLIntercept::logFlushOrFinishAfterEnqueueEnd
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (char *)in_stack_fffffffffffffd30,errorCode);
      pSVar8 = CLIntercept::config(local_48);
      if (((pSVar8->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar8 = CLIntercept::config(local_48), (pSVar8->HostPerformanceTiming & 1U) != 0 ||
          (pSVar8 = CLIntercept::config(local_48), (pSVar8->ChromeCallLogging & 1U) != 0)))) {
        local_1d8 = std::chrono::_V2::steady_clock::now();
        local_1c0 = local_1d8;
        pSVar8 = CLIntercept::config(local_48);
        if (((pSVar8->HostPerformanceTiming & 1U) != 0) &&
           (bVar4 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_48,(uint64_t)local_58), bVar4)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f8,"",(allocator *)&stack0xfffffffffffffe07);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffbd0.__d.__r,
                     (char *)in_stack_fffffffffffffbc8.__d.__r,(string *)in_stack_fffffffffffffbc0,
                     in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          std::__cxx11::string::~string(local_1f8);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe07);
        }
        pSVar8 = CLIntercept::config(local_48);
        if ((pSVar8->ChromeCallLogging & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_230,"",&local_231);
          local_240 = local_1b8;
          local_248 = local_1c0;
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.__d.__r,
                     (string *)in_stack_fffffffffffffbb0,(bool)uVar6,
                     (uint64_t)in_stack_fffffffffffffba0,in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbc8);
          std::__cxx11::string::~string(local_230);
          std::allocator<char>::~allocator((allocator<char> *)&local_231);
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      pSVar8 = CLIntercept::config(local_48);
      if (((pSVar8->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar8 = CLIntercept::config(local_48), (pSVar8->HostPerformanceTiming & 1U) != 0 ||
          (pSVar8 = CLIntercept::config(local_48), (pSVar8->ChromeCallLogging & 1U) != 0)))) {
        local_260 = std::chrono::_V2::steady_clock::now();
        local_250 = local_260;
      }
      CLIntercept::checkTimingEvents(in_stack_00000098);
      pSVar8 = CLIntercept::config(local_48);
      if (((pSVar8->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar8 = CLIntercept::config(local_48), (pSVar8->HostPerformanceTiming & 1U) != 0 ||
          (pSVar8 = CLIntercept::config(local_48), (pSVar8->ChromeCallLogging & 1U) != 0)))) {
        local_268 = std::chrono::_V2::steady_clock::now();
        local_258 = local_268;
        pSVar8 = CLIntercept::config(local_48);
        if (((pSVar8->HostPerformanceTiming & 1U) != 0) &&
           (bVar4 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_48,(uint64_t)local_58), bVar4)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_288,"",&local_289);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffbd0.__d.__r,
                     (char *)in_stack_fffffffffffffbc8.__d.__r,(string *)in_stack_fffffffffffffbc0,
                     in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          std::__cxx11::string::~string(local_288);
          std::allocator<char>::~allocator((allocator<char> *)&local_289);
        }
        pSVar8 = CLIntercept::config(local_48);
        if ((pSVar8->ChromeCallLogging & 1U) != 0) {
          paVar11 = (allocator *)&stack0xfffffffffffffd3f;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&stack0xfffffffffffffd40,"",paVar11);
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.__d.__r,
                     (string *)in_stack_fffffffffffffbb0,(bool)uVar6,
                     (uint64_t)in_stack_fffffffffffffba0,in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbc8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffd40);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd3f);
        }
      }
    }
    local_c = local_4c;
  }
  return local_c;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueSVMMigrateMem(
    cl_command_queue command_queue,
    cl_uint num_svm_pointers,
    const void** svm_pointers,
    const size_t* sizes,
    cl_mem_migration_flags flags,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clEnqueueSVMMigrateMem )
    {
        cl_int  retVal = CL_SUCCESS;

        INCREMENT_ENQUEUE_COUNTER();
        CHECK_AUBCAPTURE_START( command_queue );

        if( pIntercept->config().NullEnqueue == false )
        {
            const std::string eventWaitListString = getFormattedEventWaitList(
                pIntercept,
                num_events_in_wait_list,
                event_wait_list);

            CALL_LOGGING_ENTER( "queue = %p, num_svm_pointers = %u, flags = %s (%llX)%s",
                command_queue,
                num_svm_pointers,
                pIntercept->enumName().name_mem_migration_flags( flags ).c_str(),
                flags,
                eventWaitListString.c_str() );
            CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
            DEVICE_PERFORMANCE_TIMING_START( event );
            HOST_PERFORMANCE_TIMING_START();

            retVal = pIntercept->dispatch().clEnqueueSVMMigrateMem(
                command_queue,
                num_svm_pointers,
                svm_pointers,
                sizes,
                flags,
                num_events_in_wait_list,
                event_wait_list,
                event );

            HOST_PERFORMANCE_TIMING_END();
            DEVICE_PERFORMANCE_TIMING_END( command_queue, event );
            CHECK_ERROR( retVal );
            ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
            CALL_LOGGING_EXIT_EVENT( retVal, event );
            ADD_EVENT( event ? event[0] : NULL );
        }

        FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}